

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_manager.cpp
# Opt level: O0

void __thiscall cff::ColorManager::SetColors(ColorManager *this,Color fgCol,Color bgCol)

{
  Color bgCol_local;
  Color fgCol_local;
  ColorManager *this_local;
  
  if (fgCol == RESET) {
    SetFgColor(this,RESET);
    SetBgColor(this,bgCol);
  }
  else {
    SetBgColor(this,bgCol);
    SetFgColor(this,fgCol);
  }
  return;
}

Assistant:

void ColorManager::SetColors(Color fgCol, Color bgCol) {
        if(fgCol == Color::RESET) {
            SetFgColor(fgCol);
            SetBgColor(bgCol);
        } else {
            SetBgColor(bgCol);
            SetFgColor(fgCol);
        }
    }